

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void freeDeepBuffers<Imath_3_2::half>
               (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                *channels)

{
  void *pvVar1;
  int y;
  long lVar2;
  int x;
  long lVar3;
  _List_node_base *p_Var4;
  long lVar5;
  
  p_Var4 = (_List_node_base *)channels;
  while (p_Var4 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)channels) {
    lVar5 = 0;
    for (lVar2 = 0; lVar2 < (long)p_Var4[1]._M_next; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 < (long)p_Var4[1]._M_prev; lVar3 = lVar3 + 1) {
        pvVar1 = *(void **)((long)p_Var4[2]._M_next + lVar3 * 8 + (long)p_Var4[1]._M_prev * lVar5);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
        }
      }
      lVar5 = lVar5 + 8;
    }
  }
  return;
}

Assistant:

void
freeDeepBuffers (list<Array2D<T*>>& channels)
{
    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
            for (int x = 0; x < channel.width (); x++)
                delete[] channel[y][x];
    }
}